

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseUnqualifiedName(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined2 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  short sVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  bool bVar14;
  char *pcVar15;
  State copy;
  
  bVar11 = ParseOperatorName(state);
  bVar14 = true;
  if (bVar11) {
    return true;
  }
  pcVar15 = state->mangled_cur;
  pcVar1 = state->out_cur;
  pcVar2 = state->out_begin;
  pcVar3 = state->out_end;
  pcVar4 = state->prev_name;
  uVar5 = state->prev_name_length;
  uVar6 = state->nest_level;
  uVar7 = state->append;
  uVar8 = state->overflowed;
  if (*state->mangled_cur == 'C') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar11 = ParseCharClass(state,"123");
    if (bVar11) {
      pcVar15 = state->prev_name;
      iVar13 = state->prev_name_length;
      goto LAB_0012b34f;
    }
  }
  state->mangled_cur = pcVar15;
  state->out_cur = pcVar1;
  state->out_begin = pcVar2;
  state->out_end = pcVar3;
  state->out_begin = pcVar2;
  state->out_end = pcVar3;
  state->prev_name = pcVar4;
  state->prev_name_length = uVar5;
  state->nest_level = uVar6;
  state->append = (bool)uVar7;
  state->overflowed = (bool)uVar8;
  if (*state->mangled_cur == 'D') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar11 = ParseCharClass(state,"012");
    if (bVar11) {
      pcVar15 = state->prev_name;
      iVar13 = state->prev_name_length;
      MaybeAppend(state,"~");
LAB_0012b34f:
      MaybeAppendWithLength(state,pcVar15,iVar13);
      return true;
    }
  }
  state->out_begin = pcVar2;
  state->out_end = pcVar3;
  state->prev_name = pcVar4;
  state->prev_name_length = uVar5;
  state->nest_level = uVar6;
  state->append = (bool)uVar7;
  state->overflowed = (bool)uVar8;
  state->mangled_cur = pcVar15;
  state->out_cur = pcVar1;
  state->out_begin = pcVar2;
  state->out_end = pcVar3;
  bVar11 = ParseSourceName(state);
  if (bVar11) {
LAB_0012b37d:
    ParseAbiTags(state);
  }
  else {
    pcVar15 = state->mangled_cur;
    pcVar1 = state->out_cur;
    pcVar2 = state->out_begin;
    pcVar3 = state->out_end;
    pcVar4 = state->prev_name;
    iVar13 = state->prev_name_length;
    sVar9 = state->nest_level;
    bVar11 = state->append;
    bVar10 = state->overflowed;
    if (*state->mangled_cur == 'L') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar12 = ParseSourceName(state);
      if (bVar12) {
        ParseDiscriminator(state);
        goto LAB_0012b37d;
      }
    }
    bVar14 = false;
    state->out_begin = pcVar2;
    state->out_end = pcVar3;
    state->prev_name = pcVar4;
    state->prev_name_length = iVar13;
    state->nest_level = sVar9;
    state->append = bVar11;
    state->overflowed = bVar10;
    state->mangled_cur = pcVar15;
    state->out_cur = pcVar1;
    state->out_begin = pcVar2;
    state->out_end = pcVar3;
  }
  return bVar14;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  return (ParseOperatorName(state) ||
          ParseCtorDtorName(state) ||
          (ParseSourceName(state) && Optional(ParseAbiTags(state))) ||
          (ParseLocalSourceName(state) && Optional(ParseAbiTags(state))));
}